

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

uint ntru_ring_invert(uint16_t *out,uint16_t *in,uint p,uint q)

{
  ushort *puVar1;
  size_t __n;
  size_t n;
  uint16_t q_00;
  ushort uVar2;
  ushort uVar3;
  uint16_t uVar4;
  uint uVar5;
  uint64_t qrecip;
  ushort *__dest;
  ushort *b;
  ushort *__dest_00;
  void *__s;
  uint uVar6;
  ulong uVar7;
  short sVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong factor1;
  
  qrecip = SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff),0);
  uVar12 = p + 1;
  factor1 = (ulong)uVar12;
  __dest = (ushort *)safemalloc(factor1,2,0);
  b = (ushort *)safemalloc(factor1,2,0);
  __dest_00 = (ushort *)safemalloc(factor1,2,0);
  __s = safemalloc(factor1,2,0);
  uVar7 = (ulong)p;
  memcpy(__dest,in,uVar7 * 2);
  __dest[uVar7] = 0;
  *__dest_00 = 1;
  __n = factor1 * 2 - 2;
  if (1 < uVar12) {
    memset(__dest_00 + 1,0,__n);
  }
  q_00 = (uint16_t)q;
  b[1] = q_00 - 1;
  *b = q_00 - 1;
  if (2 < p) {
    memset(b + 2,0,uVar7 * 2 - 4);
  }
  b[uVar7] = 1;
  if (factor1 != 0) {
    memset(__s,0,factor1 * 2);
  }
  uVar11 = 0;
  do {
    uVar3 = 0;
    if (factor1 != 0) {
      uVar6 = 1;
      uVar5 = 0;
      uVar10 = 1;
      uVar9 = factor1;
      do {
        uVar6 = uVar6 & (__dest[uVar9 - 1] + 0xffff >> 0x10 ^ 1);
        uVar10 = uVar10 & (b[uVar9 - 1] + 0xffff >> 0x10 ^ 1);
        uVar5 = uVar5 | ~uVar10 & uVar6;
        uVar3 = (ushort)uVar5;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    if (factor1 != 0) {
      uVar3 = -((ushort)(*__dest + 0xffff >> 0x10) & uVar3 | (ushort)(*b + 0xffff >> 0x10) ^ 1);
      uVar9 = 0;
      do {
        uVar2 = (b[uVar9] ^ __dest[uVar9]) & uVar3;
        __dest[uVar9] = uVar2 ^ __dest[uVar9];
        b[uVar9] = b[uVar9] ^ uVar2;
        uVar9 = uVar9 + 1;
      } while (factor1 != uVar9);
      if (factor1 != 0) {
        uVar9 = 0;
        do {
          uVar2 = (*(ushort *)((long)__s + uVar9 * 2) ^ __dest_00[uVar9]) & uVar3;
          __dest_00[uVar9] = uVar2 ^ __dest_00[uVar9];
          puVar1 = (ushort *)((long)__s + uVar9 * 2);
          *puVar1 = *puVar1 ^ uVar2;
          uVar9 = uVar9 + 1;
        } while (factor1 != uVar9);
      }
    }
    if (uVar12 != 0) {
      uVar3 = *__dest;
      uVar2 = *b;
      uVar9 = 0;
      do {
        uVar5 = (uint)b[uVar9] * (uint)(ushort)(q_00 - uVar3) + (uint)__dest[uVar9] * (uint)uVar2;
        sVar8 = (short)uVar5 - (short)(qrecip * uVar5 >> 0x30) * q_00;
        uVar5 = q;
        if ((short)(sVar8 - q_00) < 0) {
          uVar5 = 0;
        }
        __dest[uVar9] = sVar8 - (short)uVar5;
        uVar9 = uVar9 + 1;
      } while (factor1 != uVar9);
      if (factor1 != 0) {
        uVar9 = 0;
        do {
          uVar5 = (uint)*(ushort *)((long)__s + uVar9 * 2) * (uint)(ushort)(q_00 - uVar3) +
                  (uint)__dest_00[uVar9] * (uint)uVar2;
          sVar8 = (short)uVar5 - (short)(qrecip * uVar5 >> 0x30) * q_00;
          uVar5 = q;
          if ((short)(sVar8 - q_00) < 0) {
            uVar5 = 0;
          }
          __dest_00[uVar9] = sVar8 - (short)uVar5;
          uVar9 = uVar9 + 1;
        } while (factor1 != uVar9);
      }
    }
    if (1 < uVar12) {
      memmove(__dest,__dest + 1,__n);
    }
    __dest[factor1 - 1] = 0;
    uVar3 = *__dest_00;
    if (1 < p) {
      memmove(__dest_00,__dest_00 + 1,uVar7 * 2 - 2);
    }
    __dest_00[p - 1] = uVar3;
    uVar5 = (q - uVar3) + (uint)*__dest_00;
    sVar8 = (short)uVar5 - (short)(qrecip * uVar5 >> 0x30) * q_00;
    uVar5 = 0;
    if (-1 < (short)(sVar8 - q_00)) {
      uVar5 = q;
    }
    *__dest_00 = sVar8 - (short)uVar5;
    uVar11 = uVar11 + 1;
  } while (uVar11 != (p * 2 | 1));
  uVar5 = (-(uint)*__dest - 0x10000 & *b + 0xffff) >> 0x10;
  if (1 < uVar12) {
    uVar11 = 1;
    do {
      uVar5 = (b[uVar11] + 0xffff >> 0x10 ^ 1) & ~(__dest[uVar11] + 0xffff) >> 0x10 & uVar5;
      uVar11 = uVar11 + 1;
    } while (factor1 != uVar11);
  }
  uVar4 = invert(*b,q_00,qrecip);
  if (p != 0) {
    uVar11 = 0;
    do {
      uVar12 = (uint)*(ushort *)((long)__s + uVar11 * 2) * (uint)uVar4;
      sVar8 = (short)uVar12 - (short)(qrecip * uVar12 >> 0x30) * q_00;
      uVar12 = q;
      if ((short)(sVar8 - q_00) < 0) {
        uVar12 = 0;
      }
      out[uVar11] = sVar8 - (short)uVar12;
      uVar11 = uVar11 + 1;
    } while (uVar7 != uVar11);
  }
  n = factor1 * 2;
  smemclr(__dest,n);
  safefree(__dest);
  smemclr(b,n);
  safefree(b);
  smemclr(__dest_00,n);
  safefree(__dest_00);
  smemclr(__s,n);
  safefree(__s);
  return uVar5;
}

Assistant:

unsigned ntru_ring_invert(uint16_t *out, const uint16_t *in,
                          unsigned p, unsigned q)
{
    SETUP;

    /* Size of the polynomial arrays we'll work with */
    const size_t SIZE = p+1;

    /* Number of steps of the algorithm is the max possible value of
     * deg A + deg B + 2, where deg A <= p-1 and deg B = p */
    const size_t STEPS = 2*p + 1;

    /* Our two working polynomials */
    uint16_t *A = snewn(SIZE, uint16_t);
    uint16_t *B = snewn(SIZE, uint16_t);

    /* Coefficient of the input value in each one */
    uint16_t *Ac = snewn(SIZE, uint16_t);
    uint16_t *Bc = snewn(SIZE, uint16_t);

    /* Initialise A to the input, and Ac correspondingly to 1 */
    memcpy(A, in, p*sizeof(uint16_t));
    A[p] = 0;
    Ac[0] = 1;
    for (size_t i = 1; i < SIZE; i++)
        Ac[i] = 0;

    /* Initialise B to the quotient polynomial of the ring, x^p-x-1
     * And Bc = 0 */
    B[0] = B[1] = q-1;
    for (size_t i = 2; i < p; i++)
        B[i] = 0;
    B[p] = 1;
    for (size_t i = 0; i < SIZE; i++)
        Bc[i] = 0;

    /* Run the gcd-finding algorithm. */
    for (size_t i = 0; i < STEPS; i++) {
        /*
         * First swap round so that A is the one we'll be dividing by x.
         *
         * In the case where one of the two polys has a zero constant
         * term, it's that one. In the other case, it's the one of
         * smaller degree. We must compute both, and choose between
         * them in a side-channel-safe way.
         */
        unsigned x_divides_A = iszero(A[0]);
        unsigned x_divides_B = iszero(B[0]);
        unsigned B_is_bigger = 0;
        {
            unsigned not_seen_top_term_of_A = 1, not_seen_top_term_of_B = 1;
            for (size_t j = SIZE; j-- > 0 ;) {
                not_seen_top_term_of_A &= iszero(A[j]);
                not_seen_top_term_of_B &= iszero(B[j]);
                B_is_bigger |= (~not_seen_top_term_of_B &
                                not_seen_top_term_of_A);
            }
        }
        unsigned need_swap = x_divides_B | (~x_divides_A & B_is_bigger);
        uint16_t swap_mask = -need_swap;
        for (size_t j = 0; j < SIZE; j++) {
            uint16_t diff = (A[j] ^ B[j]) & swap_mask;
            A[j] ^= diff;
            B[j] ^= diff;
        }
        for (size_t j = 0; j < SIZE; j++) {
            uint16_t diff = (Ac[j] ^ Bc[j]) & swap_mask;
            Ac[j] ^= diff;
            Bc[j] ^= diff;
        }

        /*
         * Replace A with a linear combination of both A and B that
         * has constant term zero, which we do by calculating
         *
         *   (constant term of B) * A - (constant term of A) * B
         *
         * In one of the two cases, A's constant term is already zero,
         * so the coefficient of B will be zero too; hence, this will
         * do nothing useful (it will merely scale A by some scalar
         * value), but it will take the same length of time as doing
         * something, which is just what we want.
         */
        uint16_t Amult = B[0], Bmult = q - A[0];
        for (size_t j = 0; j < SIZE; j++)
            A[j] = REDUCE(Amult * A[j] + Bmult * B[j]);
        /* And do the same transformation to Ac */
        for (size_t j = 0; j < SIZE; j++)
            Ac[j] = REDUCE(Amult * Ac[j] + Bmult * Bc[j]);

        /*
         * Now divide A by x, and compensate by multiplying Ac by
         * x^{p-1}-1 mod x^p-x-1.
         *
         * That multiplication is particularly easy, precisely because
         * x^{p-1}-1 is the multiplicative inverse of x! Each x^n term
         * for n>0 just moves down to the x^{n-1} term, and only the
         * constant term has to be dealt with in an interesting way.
         */
        for (size_t j = 1; j < SIZE; j++)
            A[j-1] = A[j];
        A[SIZE-1] = 0;
        uint16_t Ac0 = Ac[0];
        for (size_t j = 1; j < p; j++)
            Ac[j-1] = Ac[j];
        Ac[p-1] = Ac0;
        Ac[0] = REDUCE(Ac[0] + q - Ac0);
    }

    /*
     * Now we expect that A is 0, and B is a constant. If so, then
     * they are coprime, and we're going to return success. If not,
     * they have a common factor.
     */
    unsigned success = iszero(A[0]) & (1 ^ iszero(B[0]));
    for (size_t j = 1; j < SIZE; j++)
        success &= iszero(A[j]) & iszero(B[j]);

    /*
     * So we're going to return Bc, but first, scale it by the
     * multiplicative inverse of the constant we ended up with in
     * B[0].
     */
    uint16_t scale = INVERT(B[0]);
    for (size_t i = 0; i < p; i++)
        out[i] = REDUCE(scale * Bc[i]);

    smemclr(A, SIZE * sizeof(*A));
    sfree(A);
    smemclr(B, SIZE * sizeof(*B));
    sfree(B);
    smemclr(Ac, SIZE * sizeof(*Ac));
    sfree(Ac);
    smemclr(Bc, SIZE * sizeof(*Bc));
    sfree(Bc);

    return success;
}